

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiViewport * ImGui::FindViewportByID(ImGuiID id)

{
  ImGuiViewportP *pIVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(GImGui->Viewports).Size;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pIVar1 = (GImGui->Viewports).Data[lVar3];
      if ((pIVar1->super_ImGuiViewport).ID == id) {
        return &pIVar1->super_ImGuiViewport;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return (ImGuiViewport *)0x0;
}

Assistant:

ImGuiViewport* ImGui::FindViewportByID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int n = 0; n < g.Viewports.Size; n++)
        if (g.Viewports[n]->ID == id)
            return g.Viewports[n];
    return NULL;
}